

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pagerUndoCallback(void *pCtx,Pgno iPg)

{
  PgHdr *pPg_00;
  int iVar1;
  sqlite3_backup *p;
  long lVar2;
  u32 iFrame;
  PgHdr *pPg;
  u32 local_24;
  PgHdr *local_20;
  
  local_20 = (PgHdr *)0x0;
  iVar1 = 0;
  sqlite3PcacheFetch(*(PCache **)((long)pCtx + 0x110),iPg,0,&local_20);
  pPg_00 = local_20;
  if (local_20 != (PgHdr *)0x0) {
    if (local_20->nRef == 1) {
      sqlite3PcacheDrop(local_20);
    }
    else {
      local_24 = 0;
      iVar1 = sqlite3WalFindFrame(*(Wal **)((long)pCtx + 0x118),local_20->pgno,&local_24);
      if ((iVar1 == 0) && (iVar1 = readDbPage(pPg_00,local_24), iVar1 == 0)) {
        (**(code **)((long)pCtx + 0x100))(pPg_00);
        iVar1 = 0;
      }
      sqlite3PagerUnref(pPg_00);
    }
  }
  for (lVar2 = *(long *)((long)pCtx + 0x70); lVar2 != 0; lVar2 = *(long *)(lVar2 + 0x40)) {
    *(undefined4 *)(lVar2 + 0x18) = 1;
  }
  return iVar1;
}

Assistant:

static int pagerUndoCallback(void *pCtx, Pgno iPg){
  int rc = SQLITE_OK;
  Pager *pPager = (Pager *)pCtx;
  PgHdr *pPg;

  assert( pagerUseWal(pPager) );
  pPg = sqlite3PagerLookup(pPager, iPg);
  if( pPg ){
    if( sqlite3PcachePageRefcount(pPg)==1 ){
      sqlite3PcacheDrop(pPg);
    }else{
      u32 iFrame = 0;
      rc = sqlite3WalFindFrame(pPager->pWal, pPg->pgno, &iFrame);
      if( rc==SQLITE_OK ){
        rc = readDbPage(pPg, iFrame);
      }
      if( rc==SQLITE_OK ){
        pPager->xReiniter(pPg);
      }
      sqlite3PagerUnref(pPg);
    }
  }

  /* Normally, if a transaction is rolled back, any backup processes are
  ** updated as data is copied out of the rollback journal and into the
  ** database. This is not generally possible with a WAL database, as
  ** rollback involves simply truncating the log file. Therefore, if one
  ** or more frames have already been written to the log (and therefore 
  ** also copied into the backup databases) as part of this transaction,
  ** the backups must be restarted.
  */
  sqlite3BackupRestart(pPager->pBackup);

  return rc;
}